

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase675::run(TestCase675 *this)

{
  word *pwVar1;
  size_t sVar2;
  word *pwVar3;
  word *pwVar4;
  bool bVar5;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar6;
  Reader value;
  Builder root;
  MallocMessageBuilder builder;
  PointerBuilder local_1c8;
  OrphanBuilder local_1a8;
  StructBuilder local_188;
  OrphanBuilder local_160;
  StructBuilder local_140 [2];
  StructBuilder in_stack_ffffffffffffff20;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_140 + 1),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1c8,(MessageBuilder *)(local_140 + 1));
  local_1a8.capTable = (CapTableBuilder *)local_1c8.pointer;
  local_1a8.tag.content = (uint64_t)local_1c8.segment;
  local_1a8.segment = (SegmentBuilder *)local_1c8.capTable;
  PointerBuilder::initStruct(&local_188,(PointerBuilder *)&local_1a8,(StructSize)0x140006);
  AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
  pwVar3 = (AVar6.ptr)->ptr;
  sVar2 = (AVar6.ptr)->size_;
  local_1a8.capTable = (CapTableBuilder *)(local_188.pointers + 2);
  local_1a8.tag.content = (uint64_t)local_188.segment;
  local_1a8.segment = (SegmentBuilder *)local_188.capTable;
  PointerBuilder::initStruct(local_140,(PointerBuilder *)&local_1a8,(StructSize)0x140006);
  initTestMessage((Builder)in_stack_ffffffffffffff20);
  AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
  pwVar4 = (AVar6.ptr)->ptr + (AVar6.ptr)->size_;
  local_1a8.tag.content = (uint64_t)local_188.segment;
  local_1a8.segment = (SegmentBuilder *)local_188.capTable;
  local_1a8.capTable = (CapTableBuilder *)local_188.pointers;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_1a8,value);
  AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
  if ((AVar6.size_ != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_1c8.segment = (SegmentBuilder *)CONCAT44(local_1c8.segment._4_4_,1);
    AVar6 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)(local_140 + 1));
    local_1a8.tag.content = AVar6.size_;
    kj::_::Debug::log<char_const(&)[65],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2ad,ERROR,
               "\"failed: expected \" \"(1u) == (builder.getSegmentsForOutput().size())\", 1u, builder.getSegmentsForOutput().size()"
               ,(char (*) [65])"failed: expected (1u) == (builder.getSegmentsForOutput().size())",
               (uint *)&local_1c8,(unsigned_long *)&local_1a8);
  }
  local_1c8.pointer = local_188.pointers + 2;
  local_1c8.segment = local_188.segment;
  local_1c8.capTable = local_188.capTable;
  PointerBuilder::disown(&local_1a8,&local_1c8);
  local_160.segment = local_1a8.segment;
  local_160.capTable = local_1a8.capTable;
  local_160.location = local_1a8.location;
  local_160.tag.content = local_1a8.tag.content;
  if (local_1a8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_160);
  }
  pwVar1 = pwVar3 + sVar2;
  if (pwVar1 < pwVar4) {
    if ((char)pwVar1->content == '\0') {
      pwVar3 = pwVar3 + sVar2;
      do {
        pwVar3 = (word *)((long)&pwVar3->content + 1);
        if (pwVar3 == pwVar4) break;
      } while ((char)pwVar3->content == '\0');
      bVar5 = pwVar4 <= pwVar3;
    }
    else {
      bVar5 = false;
    }
    if ((!bVar5) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[47]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2b1,ERROR,"\"failed: expected \" \"allZero(zerosStart, zerosEnd)\"",
                 (char (*) [47])"failed: expected allZero(zerosStart, zerosEnd)");
    }
  }
  local_1a8.tag.content = (uint64_t)local_188.segment;
  local_1a8.segment = (SegmentBuilder *)local_188.capTable;
  local_1a8.capTable = (CapTableBuilder *)local_188.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_1c8,(PointerBuilder *)&local_1a8,(void *)0x0,0);
  if (((local_1c8.pointer != (WirePointer *)0x4) ||
      (*(char *)((long)&((SegmentReader *)&(local_1c8.capTable)->super_CapTableReader)->arena + 2)
       != 'o' || *(short *)&((SegmentReader *)&(local_1c8.capTable)->super_CapTableReader)->arena !=
                 0x6f66)) && (kj::_::Debug::minSeverity < 3)) {
    local_1a8.tag.content = (uint64_t)local_188.segment;
    local_1a8.segment = (SegmentBuilder *)local_188.capTable;
    local_1a8.capTable = (CapTableBuilder *)local_188.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_1c8,(PointerBuilder *)&local_1a8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x2b3,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (root.getTextField())\", \"foo\", root.getTextField()"
               ,(char (*) [50])"failed: expected (\"foo\") == (root.getTextField())",
               (char (*) [4])"foo",(Builder *)&local_1c8);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_140 + 1));
  return;
}

Assistant:

TEST(Orphans, StructsZerodAfterUse) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  const word* zerosStart = builder.getSegmentsForOutput()[0].end();
  initTestMessage(root.initStructField());
  const word* zerosEnd = builder.getSegmentsForOutput()[0].end();

  root.setTextField("foo");  // guard against overruns

  EXPECT_EQ(1u, builder.getSegmentsForOutput().size());  // otherwise test is invalid

  root.disownStructField();

  EXPECT_TRUE(allZero(zerosStart, zerosEnd));

  EXPECT_EQ("foo", root.getTextField());
}